

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O0

ParserResult *
parse_positive_command_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  bool bVar1;
  token_iterator pTVar2;
  token_iterator end_local;
  token_iterator begin_local;
  ParserContext *parser_local;
  ParserResult *result;
  
  parse_oneof<std::pair<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(*)(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*),std::pair<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(&)(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*)>
            (__return_storage_ptr__,parser,begin,end,parse_expression_statement,
             parse_actual_command_statement);
  bVar1 = is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>
                    (&__return_storage_ptr__->second);
  if (!bVar1) {
    pTVar2 = parser_aftertoken(begin,end,NewLine);
    __return_storage_ptr__->first = pTVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_positive_command_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    auto result = parse_oneof(parser, begin, end,
                              parse_expression_statement,
                              parse_actual_command_statement);
    if(is<ParserSuccess>(result.second))
        return result;
    else
    {
        result.first = parser_aftertoken(begin, end, Token::NewLine);
        return result;
    }
}